

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  
  _PDCLIB_seed = _PDCLIB_seed * 0x41c64e6d + 0x3039;
  iVar1 = (int)((long)((ulong)(uint)((int)(_PDCLIB_seed >> 0x10) >> 0x1f) << 0x20 |
                      _PDCLIB_seed >> 0x10 & 0xffffffff) % 0x8000);
  if (0x7ffe < iVar1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/rand.c, line %d - %s\n"
           ,0x1a,"( rnd1 = rand() ) < RAND_MAX");
  }
  _PDCLIB_seed = _PDCLIB_seed * 0x41c64e6d + 0x3039;
  iVar2 = (int)(_PDCLIB_seed >> 0x10) % 0x8000;
  if (0x7ffe < iVar2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/rand.c, line %d - %s\n"
           ,0x1b,"( rnd2 = rand() ) < RAND_MAX");
  }
  srand(1);
  _PDCLIB_seed = _PDCLIB_seed * 0x41c64e6d + 0x3039;
  if ((int)((long)((ulong)(uint)((int)(_PDCLIB_seed >> 0x10) >> 0x1f) << 0x20 |
                  _PDCLIB_seed >> 0x10 & 0xffffffff) % 0x8000) != iVar1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/rand.c, line %d - %s\n"
           ,0x1d,"rand() == rnd1");
  }
  _PDCLIB_seed = _PDCLIB_seed * 0x41c64e6d + 0x3039;
  if ((int)(_PDCLIB_seed >> 0x10) % 0x8000 != iVar2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdlib/rand.c, line %d - %s\n"
           ,0x1e,"rand() == rnd2");
  }
  return TEST_RESULTS;
}

Assistant:

int rand( void )
{
    _PDCLIB_seed = _PDCLIB_seed * 1103515245 + 12345;
    return ( int )( _PDCLIB_seed / 65536 ) % 32768;
}